

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceCacheVk.cpp
# Opt level: O2

VkBufferView __thiscall
Diligent::ShaderResourceCacheVk::Resource::GetBufferViewWriteInfo(Resource *this)

{
  BufferViewVkImpl *pBVar1;
  string msg;
  string local_30;
  
  if (2 < (byte)(this->Type - UniformTexelBuffer)) {
    FormatString<char[47]>
              (&local_30,(char (*) [47])"Uniform or storage buffer resource is expected");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetBufferViewWriteInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x32d);
    std::__cxx11::string::~string((string *)&local_30);
  }
  if ((this->pObject).m_pObject == (IDeviceObject *)0x0) {
    FormatString<char[60]>
              (&local_30,
               (char (*) [60])"Unable to get buffer view write info: cached object is null");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"GetBufferViewWriteInfo",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/ShaderResourceCacheVk.cpp"
               ,0x32e);
    std::__cxx11::string::~string((string *)&local_30);
  }
  pBVar1 = RefCntAutoPtr<Diligent::IDeviceObject>::ConstPtr<Diligent::BufferViewVkImpl>
                     (&this->pObject);
  return (pBVar1->m_BuffView).m_VkObject;
}

Assistant:

VkBufferView ShaderResourceCacheVk::Resource::GetBufferViewWriteInfo() const
{
    VERIFY((Type == DescriptorType::UniformTexelBuffer ||
            Type == DescriptorType::StorageTexelBuffer ||
            Type == DescriptorType::StorageTexelBuffer_ReadOnly),
           "Uniform or storage buffer resource is expected");
    DEV_CHECK_ERR(pObject != nullptr, "Unable to get buffer view write info: cached object is null");

    // The following bits must have been set at buffer creation time:
    //  * VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER  ->  VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT
    //  * VK_DESCRIPTOR_TYPE_UNIFORM_TEXEL_BUFFER  ->  VK_BUFFER_USAGE_UNIFORM_TEXEL_BUFFER_BIT
    const BufferViewVkImpl* pBuffViewVk = pObject.ConstPtr<BufferViewVkImpl>();
    return pBuffViewVk->GetVkBufferView();
}